

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
Qentem::Array<unsigned_int>::operator+=(Array<unsigned_int> *this,Array<unsigned_int> *src)

{
  SizeT SVar1;
  SizeT SVar2;
  SizeT SVar3;
  uint *puVar4;
  uint *src_end;
  uint *src_item;
  uint *storage;
  SizeT n_size;
  Array<unsigned_int> *src_local;
  Array<unsigned_int> *this_local;
  
  SVar1 = Size(this);
  SVar2 = Size(src);
  SVar3 = Capacity(this);
  if (SVar3 < SVar1 + SVar2) {
    resize(this,SVar1 + SVar2);
  }
  SVar1 = Size(src);
  this->index_ = SVar1 + this->index_;
  src_item = Storage(this);
  src_end = First(src);
  SVar1 = Size(src);
  puVar4 = src_end + SVar1;
  for (; src_end < puVar4; src_end = src_end + 1) {
    Memory::Initialize<unsigned_int>(src_item,src_end);
    src_item = src_item + 1;
  }
  return;
}

Assistant:

void operator+=(const Array &src) {
        const SizeT n_size = (Size() + src.Size());

        if (n_size > Capacity()) {
            resize(n_size);
        }

        index_ += src.Size();

        Type_T       *storage  = Storage();
        const Type_T *src_item = src.First();
        const Type_T *src_end  = (src_item + src.Size());

        while (src_item < src_end) {
            Memory::Initialize(storage, *src_item);
            ++storage;
            ++src_item;
        }
    }